

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtsStreamReader.cpp
# Opt level: O0

int __thiscall
DTSStreamReader::decodeFrame
          (DTSStreamReader *this,uint8_t *buff,uint8_t *end,int *skipBytes,int *skipBeforeBytes)

{
  uint32_t uVar1;
  uint uVar2;
  int iVar3;
  uint32_t uVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  byte *pbVar8;
  int local_d4;
  int local_cc;
  uint8_t *nextFrame;
  int hdFrameSize;
  int frameSize;
  int dataRest;
  uint8_t *exHeader;
  int i;
  int findSize;
  uint32_t *curPtr32;
  uint8_t conv_buf_2 [14];
  uint8_t conv_buf_1 [14];
  uint8_t conv_buf [14];
  uint8_t *afterFrameData;
  int *skipBeforeBytes_local;
  int *skipBytes_local;
  uint8_t *end_local;
  uint8_t *buff_local;
  DTSStreamReader *this_local;
  
  this->i_frame_size = 0;
  iVar3 = (int)buff;
  conv_buf._6_8_ = buff;
  if ((this->m_isCoreExists & 1U) != 0) {
    *skipBytes = 0;
    *skipBeforeBytes = 0;
    if ((this->m_state == stDecodeHD) &&
       (uVar1 = *(uint32_t *)buff, uVar4 = my_ntohl(0x64582025), uVar1 == uVar4)) {
      this->m_state = stDecodeHD2;
      return this->m_hdFrameLen;
    }
    this->m_state = stDecodeDTS;
    if (((((*buff == 0xff) && (buff[1] == '\x1f')) && (buff[2] == '\0')) &&
        ((buff[3] == 0xe8 && ((buff[4] & 0xf0) == 0xf0)))) && (buff[5] == '\a')) {
      buf14To16(conv_buf_1 + 6,buff,0xe,1);
      iVar5 = syncInfo16be(this,conv_buf_1 + 6);
      this->i_frame_size = iVar5;
      this->i_frame_size = (this->i_frame_size << 3) / 0xe << 1;
    }
    else if (((*buff == '\x1f') && (buff[1] == 0xff)) &&
            ((buff[2] == 0xe8 &&
             (((buff[3] == '\0' && (buff[4] == '\a')) && ((buff[5] & 0xf0) == 0xf0)))))) {
      buf14To16(conv_buf_2 + 6,buff,0xe,0);
      iVar5 = syncInfo16be(this,conv_buf_2 + 6);
      this->i_frame_size = iVar5;
      this->i_frame_size = (this->i_frame_size << 3) / 0xe << 1;
    }
    else if (((*buff == '\x7f') && (buff[1] == 0xfe)) && ((buff[2] == 0x80 && (buff[3] == '\x01'))))
    {
      iVar5 = syncInfo16be(this,buff);
      this->i_frame_size = iVar5;
    }
    else {
      if (((*buff != 0xfe) || (buff[1] != '\x7f')) || ((buff[2] != '\x01' || (buff[3] != 0x80)))) {
        return 0;
      }
      BufLeToBe((uint8_t *)((long)&curPtr32 + 6),buff,0xe);
      iVar5 = syncInfo16be(this,buff);
      this->i_frame_size = iVar5;
    }
    switch((short)this->pi_audio_mode) {
    case 0:
      this->pi_channels_conf = 1;
      break;
    case 1:
      this->pi_channels_conf = 0x20006;
      break;
    case 2:
    case 3:
    case 4:
      this->pi_channels = '\x02';
      this->pi_channels_conf = 6;
      break;
    case 5:
      this->pi_channels = '\x03';
      this->pi_channels_conf = 7;
      break;
    case 6:
      this->pi_channels = '\x03';
      this->pi_channels_conf = 0x16;
      break;
    case 7:
      this->pi_channels = '\x04';
      this->pi_channels_conf = 0x17;
      break;
    case 8:
      this->pi_channels = '\x04';
      this->pi_channels_conf = 0x66;
      break;
    case 9:
      this->pi_channels = '\x05';
      this->pi_channels_conf = 0x67;
      break;
    case 10:
    case 0xb:
      this->pi_channels = '\x06';
      this->pi_channels_conf = 0x366;
      break;
    case 0xc:
      this->pi_channels = '\a';
      this->pi_channels_conf = 0x367;
      break;
    case 0xd:
    case 0xe:
      this->pi_channels = '\b';
      this->pi_channels_conf = 0x1367;
      break;
    default:
      if (0x3f < this->pi_audio_mode) {
        return 0;
      }
      this->pi_channels = '\0';
      this->pi_channels_conf = 0;
    }
    if ((this->pi_audio_mode & 0x10000U) != 0) {
      this->pi_channels = this->pi_channels + '\x01';
      this->pi_channels_conf = this->pi_channels_conf | 0x1000;
      this->pi_lfeCnt = 1;
    }
    uVar2 = this->pi_sample_rate_index;
    sVar7 = std::size<int,16ul>(&ppi_dts_samplerate);
    if (sVar7 <= uVar2) {
      return 0;
    }
    this->pi_sample_rate = ppi_dts_samplerate[this->pi_sample_rate_index];
    if (this->pi_sample_rate == 0) {
      return 0;
    }
    uVar2 = this->pi_bit_rate_index;
    sVar7 = std::size<int,32ul>(&ppi_dts_bitrate);
    if (sVar7 <= uVar2) {
      return 0;
    }
    this->pi_bit_rate = ppi_dts_bitrate[this->pi_bit_rate_index];
    if (this->pi_bit_rate == 0) {
      return 0;
    }
    this->pi_frame_length = (this->nblks + 1) * 0x20;
    this->m_frameDuration =
         ((double)this->pi_frame_length * 5292000000.0) / (double)this->pi_sample_rate;
    conv_buf._6_8_ = buff + this->i_frame_size;
    if (end + -4 < (ulong)conv_buf._6_8_) {
      return -10;
    }
    if (((this->m_testMode & 1U) != 0) && (this->m_dtsEsChannels == 0)) {
      if (this->i_frame_size < (int)end - iVar3) {
        local_cc = this->i_frame_size;
      }
      else {
        local_cc = (int)end - iVar3;
      }
      _i = buff + 0x10;
      for (exHeader._0_4_ = 0; (int)exHeader < local_cc / 4 + -4; exHeader._0_4_ = (int)exHeader + 1
          ) {
        pbVar8 = _i + 4;
        if (*(int *)_i == 0x5a5a5a5a) {
          iVar5 = (iVar3 + this->i_frame_size) - (int)pbVar8;
          iVar6 = (uint)*pbVar8 * 4 + ((int)(uint)_i[5] >> 6) + -4;
          if ((iVar5 == iVar6) || (iVar5 - iVar6 == 1)) {
            this->m_dtsEsChannels = (int)(uint)_i[5] >> 2 & 7;
          }
        }
        _i = pbVar8;
      }
    }
  }
  uVar1 = *(uint32_t *)conv_buf._6_8_;
  uVar4 = my_ntohl(0x64582025);
  if (uVar1 == uVar4) {
    this->m_dts_hd_mode = true;
    iVar5 = decodeHdInfo(this,(uint8_t *)conv_buf._6_8_,end);
    if (iVar5 == -10) {
      this_local._4_4_ = -10;
    }
    else if ((uint8_t *)(conv_buf._6_8_ + (long)iVar5) < end) {
      iVar5 = (int)(uint8_t *)(conv_buf._6_8_ + (long)iVar5);
      if ((this->m_downconvertToDTS & 1U) == 0) {
        this->m_state = stDecodeHD;
        this->m_hdFrameLen = iVar5 - (int)conv_buf._6_8_;
        if ((this->m_isCoreExists & 1U) == 0) {
          local_d4 = this->m_hdFrameLen;
        }
        else {
          local_d4 = this->i_frame_size;
        }
        this_local._4_4_ = local_d4;
      }
      else {
        *skipBytes = (iVar5 - iVar3) - this->i_frame_size;
        this_local._4_4_ = this->i_frame_size;
      }
    }
    else {
      this_local._4_4_ = -10;
    }
  }
  else {
    this_local._4_4_ = this->i_frame_size;
  }
  return this_local._4_4_;
}

Assistant:

int DTSStreamReader::decodeFrame(uint8_t* buff, uint8_t* end, int& skipBytes, int& skipBeforeBytes)
{
    uint8_t* afterFrameData = buff;
    i_frame_size = 0;
    if (m_isCoreExists)
    {
        skipBeforeBytes = skipBytes = 0;
        if (m_state == DTSDecodeState::stDecodeHD && *reinterpret_cast<uint32_t*>(buff) == my_htonl(DTS_HD_PREFIX))
        {
            m_state = DTSDecodeState::stDecodeHD2;
            return m_hdFrameLen;
        }
        m_state = DTSDecodeState::stDecodeDTS;

        // 14 bits, little endian version of the bitstream
        if (buff[0] == 0xff && buff[1] == 0x1f && buff[2] == 0x00 && buff[3] == 0xe8 && (buff[4] & 0xf0) == 0xf0 &&
            buff[5] == 0x07)
        {
            uint8_t conv_buf[DTS_HEADER_SIZE];
            buf14To16(conv_buf, buff, DTS_HEADER_SIZE, 1);
            i_frame_size = syncInfo16be(conv_buf);
            i_frame_size = i_frame_size * 8 / 14 * 2;
        }
        // 14 bits, big endian version of the bitstream
        else if (buff[0] == 0x1f && buff[1] == 0xff && buff[2] == 0xe8 && buff[3] == 0x00 && buff[4] == 0x07 &&
                 (buff[5] & 0xf0) == 0xf0)
        {
            uint8_t conv_buf[DTS_HEADER_SIZE];
            buf14To16(conv_buf, buff, DTS_HEADER_SIZE, 0);
            i_frame_size = syncInfo16be(conv_buf);
            i_frame_size = i_frame_size * 8 / 14 * 2;
        }
        // 16 bits, big endian version of the bitstream
        else if (buff[0] == 0x7f && buff[1] == 0xfe && buff[2] == 0x80 && buff[3] == 0x01)
        {
            i_frame_size = syncInfo16be(buff);
        }
        // 16 bits, little endian version of the bitstream
        else if (buff[0] == 0xfe && buff[1] == 0x7f && buff[2] == 0x01 && buff[3] == 0x80)
        {
            uint8_t conv_buf[DTS_HEADER_SIZE];
            BufLeToBe(conv_buf, buff, DTS_HEADER_SIZE);
            i_frame_size = syncInfo16be(buff);
        }
        else
            return 0;

        switch (pi_audio_mode & 0xffff)
        {
        case 0x0:
            // Mono
            pi_channels_conf = AOUT_CHAN_CENTER;
            break;
        case 0x1:
            // Dual-mono = stereo + dual-mono
            pi_channels_conf = AOUT_CHAN_LEFT | AOUT_CHAN_RIGHT | AOUT_CHAN_DUALMONO;
            break;
        case 0x2:
        case 0x3:
        case 0x4:
            // Stereo
            pi_channels = 2;
            pi_channels_conf = AOUT_CHAN_LEFT | AOUT_CHAN_RIGHT;
            break;
        case 0x5:
            // 3F
            pi_channels = 3;
            pi_channels_conf = AOUT_CHAN_LEFT | AOUT_CHAN_RIGHT | AOUT_CHAN_CENTER;
            break;
        case 0x6:
            // 2F/1R
            pi_channels = 3;
            pi_channels_conf = AOUT_CHAN_LEFT | AOUT_CHAN_RIGHT | AOUT_CHAN_REARCENTER;
            break;
        case 0x7:
            // 3F/1R
            pi_channels = 4;
            pi_channels_conf = AOUT_CHAN_LEFT | AOUT_CHAN_RIGHT | AOUT_CHAN_CENTER | AOUT_CHAN_REARCENTER;
            break;
        case 0x8:
            // 2F2R
            pi_channels = 4;
            pi_channels_conf = AOUT_CHAN_LEFT | AOUT_CHAN_RIGHT | AOUT_CHAN_REARLEFT | AOUT_CHAN_REARRIGHT;
            break;
        case 0x9:
            // 3F2R
            pi_channels = 5;
            pi_channels_conf =
                AOUT_CHAN_LEFT | AOUT_CHAN_RIGHT | AOUT_CHAN_CENTER | AOUT_CHAN_REARLEFT | AOUT_CHAN_REARRIGHT;
            break;
        case 0xA:
        case 0xB:
            // 2F2M2R
            pi_channels = 6;
            pi_channels_conf = AOUT_CHAN_LEFT | AOUT_CHAN_RIGHT | AOUT_CHAN_MIDDLELEFT | AOUT_CHAN_MIDDLERIGHT |
                               AOUT_CHAN_REARLEFT | AOUT_CHAN_REARRIGHT;
            break;
        case 0xC:
            // 3F2M2R
            pi_channels = 7;
            pi_channels_conf = AOUT_CHAN_LEFT | AOUT_CHAN_RIGHT | AOUT_CHAN_CENTER | AOUT_CHAN_MIDDLELEFT |
                               AOUT_CHAN_MIDDLERIGHT | AOUT_CHAN_REARLEFT | AOUT_CHAN_REARRIGHT;
            break;
        case 0xD:
        case 0xE:
            // 3F2M2R/LFE
            pi_channels = 8;
            pi_channels_conf = AOUT_CHAN_LEFT | AOUT_CHAN_RIGHT | AOUT_CHAN_CENTER | AOUT_CHAN_MIDDLELEFT |
                               AOUT_CHAN_MIDDLERIGHT | AOUT_CHAN_REARLEFT | AOUT_CHAN_REARRIGHT | AOUT_CHAN_LFE;
            break;
        default:
            if (pi_audio_mode <= 63)
            {
                // User defined
                pi_channels = 0;
                pi_channels_conf = 0;
            }
            else
                return 0;
        }

        if (pi_audio_mode & 0x10000)
        {
            (pi_channels)++;
            pi_channels_conf |= AOUT_CHAN_LFE;
            pi_lfeCnt = 1;
        }

        if (pi_sample_rate_index >= std::size(ppi_dts_samplerate))
        {
            return 0;
        }
        pi_sample_rate = ppi_dts_samplerate[pi_sample_rate_index];
        if (!pi_sample_rate)
            return 0;

        if (pi_bit_rate_index >= std::size(ppi_dts_bitrate))
        {
            return 0;
        }
        pi_bit_rate = ppi_dts_bitrate[pi_bit_rate_index];
        if (!pi_bit_rate)
            return 0;

        pi_frame_length = (nblks + 1) * 32;
        m_frameDuration = static_cast<double>(pi_frame_length) * INTERNAL_PTS_FREQ / pi_sample_rate;

        afterFrameData = buff + i_frame_size;
        if (afterFrameData > end - 4)
            return NOT_ENOUGH_BUFFER;

        if (m_testMode && m_dtsEsChannels == 0)
        {
            auto curPtr32 = reinterpret_cast<uint32_t*>(buff + 16);
            const int findSize = FFMIN((int)(end - buff), i_frame_size) / 4 - 4;
            for (int i = 0; i < findSize; ++i)
            {
                if (*curPtr32++ == 0x5a5a5a5a)
                {
                    const auto exHeader = reinterpret_cast<uint8_t*>(curPtr32);
                    const int dataRest = static_cast<int>(buff + i_frame_size - exHeader);
                    const int frameSize = (exHeader[0] << 2) + (exHeader[1] >> 6) - 4;  // remove 4 bytes of ext world
                    if (dataRest - frameSize == 0 || dataRest - frameSize == 1)
                    {
                        m_dtsEsChannels = (static_cast<int>(exHeader[1]) >> 2) & 0x07;
                    }
                }
            }
        }
    }

    if (*reinterpret_cast<uint32_t*>(afterFrameData) == my_htonl(DTS_HD_PREFIX))
    {
        m_dts_hd_mode = true;

        const int hdFrameSize = decodeHdInfo(afterFrameData, end);
        if (hdFrameSize == NOT_ENOUGH_BUFFER)
            return NOT_ENOUGH_BUFFER;

        const uint8_t* nextFrame = afterFrameData + hdFrameSize;
        if (nextFrame >= end)
            return NOT_ENOUGH_BUFFER;
        if (m_downconvertToDTS)
        {
            skipBytes = static_cast<int>(nextFrame - buff - i_frame_size);
            return i_frame_size;
        }
        m_state = DTSDecodeState::stDecodeHD;
        m_hdFrameLen = static_cast<int>(nextFrame - afterFrameData);
        return m_isCoreExists ? i_frame_size : m_hdFrameLen;
    }
    return i_frame_size;
}